

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateDescriptor.cpp
# Opt level: O0

void __thiscall
amrex::StateDescriptor::StateDescriptor
          (StateDescriptor *this,IndexType btyp,TimeCenter ttyp,int ident,int nextra,int num_comp,
          InterpBase *a_interp,bool a_extrap,bool a_store_in_checkpoint)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined4 *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  undefined8 in_stack_00000008;
  byte in_stack_00000010;
  byte in_stack_00000018;
  undefined4 *__new_size;
  vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *this_00;
  
  *in_RDI = in_ESI;
  in_RDI[1] = in_EDX;
  in_RDI[2] = in_ECX;
  in_RDI[3] = in_R9D;
  in_RDI[4] = in_R8D;
  *(undefined8 *)(in_RDI + 6) = in_stack_00000008;
  *(byte *)(in_RDI + 8) = in_stack_00000010 & 1;
  *(byte *)((long)in_RDI + 0x21) = in_stack_00000018 & 1;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::Vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x13bc9b7);
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::Vector
            ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0x13bc9ca);
  Vector<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>,_std::allocator<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>_>_>
  ::Vector((Vector<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>,_std::allocator<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>_>_>
            *)0x13bc9dd);
  Vector<int,_std::allocator<int>_>::Vector((Vector<int,_std::allocator<int>_> *)0x13bc9f0);
  __new_size = in_RDI + 0x22;
  Vector<int,_std::allocator<int>_>::Vector((Vector<int,_std::allocator<int>_> *)0x13bca06);
  this_00 = (vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)(in_RDI + 0x28);
  Vector<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>::Vector
            ((Vector<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_> *)0x13bca1c);
  Vector<int,_std::allocator<int>_>::Vector((Vector<int,_std::allocator<int>_> *)0x13bca32);
  Vector<int,_std::allocator<int>_>::Vector((Vector<int,_std::allocator<int>_> *)0x13bca48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this_00,(size_type)__new_size);
  std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::resize(this_00,(size_type)__new_size);
  std::
  vector<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>,_std::allocator<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>_>_>
  ::resize((vector<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>,_std::allocator<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>_>_>
            *)this_00,(size_type)__new_size);
  std::vector<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>::resize
            ((vector<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_> *)this_00,
             (size_type)__new_size);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)this_00,(size_type)__new_size);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)this_00,(size_type)__new_size);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)this_00,(size_type)__new_size);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)this_00,(size_type)__new_size);
  return;
}

Assistant:

StateDescriptor::StateDescriptor (IndexType                   btyp,
                                  StateDescriptor::TimeCenter ttyp,
                                  int                         ident,
                                  int                         nextra,
                                  int                         num_comp,
                                  InterpBase*                 a_interp,
                                  bool                        a_extrap,
                                  bool                        a_store_in_checkpoint)
    :
    type(btyp),
    t_type(ttyp),
    id(ident),
    ncomp(num_comp),
    ngrow(nextra),
    mapper(a_interp),
    m_extrap(a_extrap),
    m_store_in_checkpoint(a_store_in_checkpoint)
{
    BL_ASSERT (num_comp > 0);

    names.resize(num_comp);
    bc.resize(num_comp);
    bc_func.resize(num_comp);
    mapper_comp.resize(num_comp);
    m_primary.resize(num_comp);
    m_groupsize.resize(num_comp);
    max_map_start_comp.resize(num_comp);
    min_map_end_comp.resize(num_comp);
}